

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O1

void test_dt_base64Binary(void)

{
  char cVar1;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  undefined8 *puVar2;
  char cVar3;
  bool bVar4;
  XSValue_Data *pXVar5;
  XSValue *pXVar6;
  wchar16 *pwVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  void *pvVar11;
  char *pcVar12;
  Status myStatus;
  char lex_iv_1 [8];
  Status myStatus_8;
  char lex_iv_2 [12];
  char lex_v_2 [10];
  char lex_v_2_canrep [9];
  char lex_v_1_canrep [13];
  char lex_v_1 [21];
  StrX local_148;
  undefined8 local_138;
  char local_130 [12];
  Status local_124;
  char local_120 [16];
  char local_110 [16];
  undefined8 *local_100;
  char local_f8 [16];
  char local_e8 [16];
  char local_d8 [32];
  undefined8 *local_b8;
  undefined8 local_b0;
  undefined8 *puStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 *puStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  builtin_strncpy(local_d8,"  134x cv56 gui0   \n",0x15);
  builtin_strncpy(local_110,"wxtz 8e4k",10);
  builtin_strncpy(local_120,"134xcv56gui",0xc);
  builtin_strncpy(local_130,"wxtz8e4",8);
  local_100 = (undefined8 *)operator_new__(9);
  *local_100 = 0xe8827afe72317ed7;
  *(undefined1 *)(local_100 + 1) = 0xb4;
  local_b8 = (undefined8 *)operator_new__(9);
  *local_b8 = 0x24eef1731bc3;
  *(undefined1 *)(local_b8 + 1) = 0;
  builtin_strncpy(local_e8 + 8,"gui0",5);
  builtin_strncpy(local_e8,"134xcv56",8);
  builtin_strncpy(local_f8,"wxtz8e4k",9);
  local_138 = (char *)((ulong)local_138._4_4_ << 0x20);
  local_148.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_148.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_148.fUnicodeForm,dt_base64Binary,(Status *)&local_138,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_148);
  if (cVar3 == '\0') {
    StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xda7,local_d8,local_148.fLocalForm,1);
    StrX::~StrX(&local_148);
    errSeen = 1;
  }
  local_138 = (char *)((ulong)local_138 & 0xffffffff00000000);
  local_148.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_110,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_148.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_110,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_148.fUnicodeForm,dt_base64Binary,(Status *)&local_138,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_148);
  if (cVar3 == '\0') {
    StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xda8,local_110,local_148.fLocalForm,1);
    StrX::~StrX(&local_148);
    errSeen = 1;
  }
  local_138 = (char *)((ulong)local_138 & 0xffffffff00000000);
  local_148.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_130,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_148.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_130,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_148.fUnicodeForm,dt_base64Binary,(Status *)&local_138,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_148);
  if (cVar3 == '\0') {
    if ((Status)local_138 != st_FOCA0002) {
      StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      if (((ulong)local_138 & 0xffffffff) < 0xb) {
        pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_138 & 0xffffffff];
      }
      else {
        pcVar12 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0xdab,local_130,local_148.fLocalForm,"st_FOCA0002",pcVar12);
      goto LAB_0011ff8c;
    }
  }
  else {
    StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xdab,local_130,local_148.fLocalForm,0);
LAB_0011ff8c:
    StrX::~StrX(&local_148);
    errSeen = 1;
  }
  local_138 = (char *)((ulong)local_138 & 0xffffffff00000000);
  local_148.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_120,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_148.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_120,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar3 = xercesc_4_0::XSValue::validate
                    (local_148.fUnicodeForm,dt_base64Binary,(Status *)&local_138,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_148);
  if (cVar3 == '\0') {
    if ((Status)local_138 == st_FOCA0002) goto LAB_00120092;
    StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    if (((ulong)local_138 & 0xffffffff) < 0xb) {
      pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_138 & 0xffffffff];
    }
    else {
      pcVar12 = "st_UnknownType";
    }
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0xdac,local_120,local_148.fLocalForm,"st_FOCA0002",pcVar12);
  }
  else {
    StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0xdac,local_120,local_148.fLocalForm,0);
  }
  StrX::~StrX(&local_148);
  errSeen = 1;
LAB_00120092:
  iVar10 = 1;
  do {
    local_138 = (char *)((ulong)local_138 & 0xffffffff00000000);
    local_148.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_148.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0xf;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_148.fUnicodeForm,dt_base64Binary,(Status *)&local_138,ver_10,
                        iVar10 == 1,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_148);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdc6,local_d8);
      StrX::~StrX(&local_148);
      errSeen = 1;
    }
    else {
      puStack_80 = local_100;
      local_68 = local_38;
      local_78 = local_48;
      uStack_70 = uStack_40;
      expValue.fValue.f_long = (int64_t)local_100;
      expValue._0_8_ = local_88;
      expValue.fValue._8_8_ = local_48;
      expValue.fValue._16_8_ = uStack_40;
      expValue.fValue.f_datetime.f_milisec = (double)local_38;
      bVar4 = compareActualValue(dt_base64Binary,*pXVar5,expValue);
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_138 = (char *)((ulong)local_138 & 0xffffffff00000000);
    local_148.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_110,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_148.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_110,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar11 = (void *)0xf;
    pXVar5 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_148.fUnicodeForm,dt_base64Binary,(Status *)&local_138,ver_10,
                        iVar10 == 1,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_148);
    if (pXVar5 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdc7,local_110);
      StrX::~StrX(&local_148);
      errSeen = 1;
    }
    else {
      puStack_a8 = local_b8;
      local_90 = local_50;
      local_a0 = local_60;
      uStack_98 = uStack_58;
      expValue_00.fValue.f_long = (int64_t)local_b8;
      expValue_00._0_8_ = local_b0;
      expValue_00.fValue._8_8_ = local_60;
      expValue_00.fValue._16_8_ = uStack_58;
      expValue_00.fValue.f_datetime.f_milisec = (double)local_50;
      bVar4 = compareActualValue(dt_base64Binary,*pXVar5,expValue_00);
      if (!bVar4) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar5);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar5,pvVar11);
    }
    local_138 = (char *)((ulong)local_138 & 0xffffffff00000000);
    local_148.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_130,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_148.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_130,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_148.fUnicodeForm,dt_base64Binary,(Status *)&local_138,ver_10,
                        iVar10 == 1,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_148);
    if (pXVar6 == (XSValue *)0x0) {
      if ((Status)local_138 != st_FOCA0002) {
        StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_138 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_138 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xdca,local_130,local_148.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_148);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      pvVar11 = (void *)0xdca;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdca,local_130);
      StrX::~StrX(&local_148);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar11);
    }
    local_138 = (char *)((ulong)local_138 & 0xffffffff00000000);
    local_148.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_120,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_148.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_120,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar6 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_148.fUnicodeForm,dt_base64Binary,(Status *)&local_138,ver_10,
                        iVar10 == 1,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_148);
    if (pXVar6 == (XSValue *)0x0) {
      if ((Status)local_138 != st_FOCA0002) {
        StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_138 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_138 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0xdcb,local_120,local_148.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_148);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      pvVar11 = (void *)0xdcb;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdcb,local_120);
      StrX::~StrX(&local_148);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar11);
    }
    iVar10 = iVar10 + -1;
  } while (iVar10 == 0);
  local_100 = (undefined8 *)0x0;
  do {
    iVar10 = (int)local_100;
    local_124 = st_Init;
    local_148.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_148.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_148.fUnicodeForm,dt_base64Binary,&local_124,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_148);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xde7,local_d8);
      StrX::~StrX(&local_148);
      errSeen = 1;
      iVar10 = (int)local_100;
    }
    else {
      local_138 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_e8;
      iVar10 = (int)local_100;
      if (local_138 != pcVar12) {
        pcVar8 = local_138;
        if (local_138 == (char *)0x0) {
LAB_0012065b:
          if (*pcVar12 == '\0') goto LAB_001206ab;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_0012065b;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xde7,local_d8,local_148.fLocalForm,local_138,local_e8);
        StrX::~StrX(&local_148);
        errSeen = 1;
      }
LAB_001206ab:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&local_138,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_124 = st_Init;
    local_148.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_110,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_148.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_110,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar7 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_148.fUnicodeForm,dt_base64Binary,&local_124,ver_10,iVar10 == 0,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_148);
    if (pwVar7 == (wchar16 *)0x0) {
      StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xde8,local_110);
      StrX::~StrX(&local_148);
      errSeen = 1;
    }
    else {
      local_138 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar12 = local_f8;
      if (local_138 != pcVar12) {
        pcVar8 = local_138;
        if (local_138 == (char *)0x0) {
LAB_001207a1:
          if (*pcVar12 == '\0') goto LAB_001207f1;
        }
        else {
          do {
            cVar3 = *pcVar8;
            if (cVar3 == '\0') goto LAB_001207a1;
            pcVar8 = pcVar8 + 1;
            cVar1 = *pcVar12;
            pcVar12 = pcVar12 + 1;
          } while (cVar3 == cVar1);
        }
        StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0xde8,local_110,local_148.fLocalForm,local_138,local_f8);
        StrX::~StrX(&local_148);
        errSeen = 1;
      }
LAB_001207f1:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar7);
      xercesc_4_0::XMLString::release
                ((char **)&local_138,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    bVar4 = (int)local_100 == 0;
    local_138 = (char *)((ulong)local_138 & 0xffffffff00000000);
    local_148.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_130,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_148.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_130,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_148.fUnicodeForm,dt_base64Binary,(Status *)&local_138,ver_10,bVar4,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_148);
    puVar2 = local_100;
    if (lVar9 == 0) {
      if ((Status)local_138 != st_FOCA0002) {
        StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_138 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_138 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xdeb,local_130,local_148.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_148);
        goto LAB_00120919;
      }
    }
    else {
      StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdeb,local_130);
      StrX::~StrX(&local_148);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar9);
LAB_00120919:
      errSeen = 1;
    }
    iVar10 = (int)puVar2;
    local_138 = (char *)((ulong)local_138 & 0xffffffff00000000);
    local_148.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_120,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_148.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_120,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar9 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_148.fUnicodeForm,dt_base64Binary,(Status *)&local_138,ver_10,
                       iVar10 == 0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_148);
    if (lVar9 == 0) {
      if ((Status)local_138 != st_FOCA0002) {
        StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
        pcVar12 = "st_UnknownType";
        if (((ulong)local_138 & 0xffffffff) < 0xb) {
          pcVar12 = (&PTR_anon_var_dwarf_11d7_00142bc8)[(ulong)local_138 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0xdec,local_120,local_148.fLocalForm,"st_FOCA0002",pcVar12);
        StrX::~StrX(&local_148);
        goto LAB_00120a1e;
      }
    }
    else {
      StrX::StrX(&local_148,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_BASE64BINARY);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0xdec,local_120);
      StrX::~StrX(&local_148);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar9);
LAB_00120a1e:
      errSeen = 1;
    }
    local_100 = (undefined8 *)(ulong)(iVar10 + 1);
    if (iVar10 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_base64Binary()
{
    const XSValue::DataType dt = XSValue::dt_base64Binary;
    bool  toValidate = true;

    const char lex_v_1[]="  134x cv56 gui0   \n";
    const char lex_v_2[]="wxtz 8e4k";

    const char lex_iv_2[]="134xcv56gui";
    const char lex_iv_1[]="wxtz8e4";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    //actual values:
    //"134x cv56 gui0"  :     D7 7E 31 72 FE 7A 82 E8 B4
    //"wxtz 8e4k"       :     C3 1B 73 F1 EE 24
    act_v_ran_v_1.fValue.f_byteVal = new XMLByte[9];
    act_v_ran_v_1.fValue.f_byteVal[0] = 0xd7;
    act_v_ran_v_1.fValue.f_byteVal[1] = 0x7e;
    act_v_ran_v_1.fValue.f_byteVal[2] = 0x31;
    act_v_ran_v_1.fValue.f_byteVal[3] = 0x72;
    act_v_ran_v_1.fValue.f_byteVal[4] = 0xfe;
    act_v_ran_v_1.fValue.f_byteVal[5] = 0x7a;
    act_v_ran_v_1.fValue.f_byteVal[6] = 0x82;
    act_v_ran_v_1.fValue.f_byteVal[7] = 0xe8;
    act_v_ran_v_1.fValue.f_byteVal[8] = 0xb4;
    act_v_ran_v_2.fValue.f_byteVal = new XMLByte[9];
    act_v_ran_v_2.fValue.f_byteVal[0] = 0xc3;
    act_v_ran_v_2.fValue.f_byteVal[1] = 0x1b;
    act_v_ran_v_2.fValue.f_byteVal[2] = 0x73;
    act_v_ran_v_2.fValue.f_byteVal[3] = 0xf1;
    act_v_ran_v_2.fValue.f_byteVal[4] = 0xee;
    act_v_ran_v_2.fValue.f_byteVal[5] = 0x24;
    act_v_ran_v_2.fValue.f_byteVal[6] = 0;
    act_v_ran_v_2.fValue.f_byteVal[7] = 0;
    act_v_ran_v_2.fValue.f_byteVal[8] = 0;

    const char lex_v_1_canrep[]="134xcv56gui0";
    const char lex_v_2_canrep[]="wxtz8e4k";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid                                  true              n/a
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid
    VALIDATE_TEST(lex_v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(lex_v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid                                    XSValue         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid                                    XSValue         n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        // lexical valid
        ACTVALUE_TEST(lex_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);

        // lexical invalid
        ACTVALUE_TEST(lex_iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(lex_iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *  lexical valid                                    XMLCh            n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid                                    XMLCh            n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        // lexical valid
        CANREP_TEST(lex_v_1,  dt, toValidate, EXP_RET_CANREP_TRUE, lex_v_1_canrep, DONT_CARE);
        CANREP_TEST(lex_v_2,  dt, toValidate, EXP_RET_CANREP_TRUE, lex_v_2_canrep, DONT_CARE);

        // lexical invalid
        CANREP_TEST(lex_iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,   XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,   XSValue::st_FOCA0002);
    }

}